

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

wchar_t edit_pathname(bsdtar_conflict *bsdtar,archive_entry *entry)

{
  int iVar1;
  char *pcVar2;
  archive_entry *paVar3;
  long in_RDI;
  bool bVar4;
  int in_stack_00000010;
  int in_stack_00000014;
  char **in_stack_00000018;
  char *q;
  bsdtar *in_stack_00000028;
  wchar_t slashonly;
  char *p;
  char *rp;
  char *linkname;
  wchar_t r;
  char *subst_name;
  char *name;
  archive_entry *in_stack_ffffffffffffff88;
  archive_entry *paVar5;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  archive_entry *local_48;
  char *local_28;
  archive_entry *local_20;
  wchar_t local_4;
  
  local_20 = (archive_entry *)archive_entry_pathname(in_stack_ffffffffffffff88);
  iVar1 = apply_substitution(in_stack_00000028,q,in_stack_00000018,in_stack_00000014,
                             in_stack_00000010);
  if (iVar1 == -1) {
    lafe_warnc(0,"Invalid substitution, skipping entry");
    local_4 = L'\x01';
  }
  else {
    if (iVar1 == 1) {
      archive_entry_copy_pathname
                ((archive_entry *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                 (char *)in_stack_ffffffffffffff88);
      if (*local_28 == '\0') {
        free(local_28);
        return L'\xffffffff';
      }
      free(local_28);
      local_20 = (archive_entry *)archive_entry_pathname(in_stack_ffffffffffffff88);
    }
    pcVar2 = archive_entry_hardlink(in_stack_ffffffffffffff88);
    if (pcVar2 != (char *)0x0) {
      archive_entry_hardlink(in_stack_ffffffffffffff88);
      iVar1 = apply_substitution(in_stack_00000028,q,in_stack_00000018,in_stack_00000014,
                                 in_stack_00000010);
      if (iVar1 == -1) {
        lafe_warnc(0,"Invalid substitution, skipping entry");
        return L'\x01';
      }
      if (iVar1 == 1) {
        archive_entry_copy_hardlink
                  ((archive_entry *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   (char *)in_stack_ffffffffffffff88);
        free(local_28);
      }
    }
    pcVar2 = archive_entry_symlink(in_stack_ffffffffffffff88);
    if (pcVar2 != (char *)0x0) {
      archive_entry_symlink(in_stack_ffffffffffffff88);
      iVar1 = apply_substitution(in_stack_00000028,q,in_stack_00000018,in_stack_00000014,
                                 in_stack_00000010);
      if (iVar1 == -1) {
        lafe_warnc(0,"Invalid substitution, skipping entry");
        return L'\x01';
      }
      if (iVar1 == 1) {
        archive_entry_copy_symlink
                  ((archive_entry *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   (char *)in_stack_ffffffffffffff88);
        free(local_28);
      }
    }
    if (0 < *(int *)(in_RDI + 0x2c)) {
      pcVar2 = archive_entry_hardlink(in_stack_ffffffffffffff88);
      local_20 = (archive_entry *)strip_components((char *)local_20,*(wchar_t *)(in_RDI + 0x2c));
      if (local_20 == (archive_entry *)0x0) {
        return L'\x01';
      }
      if (pcVar2 != (char *)0x0) {
        pcVar2 = strip_components(pcVar2,*(wchar_t *)(in_RDI + 0x2c));
        if (pcVar2 == (char *)0x0) {
          return L'\x01';
        }
        archive_entry_copy_hardlink
                  ((archive_entry *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   (char *)in_stack_ffffffffffffff88);
      }
    }
    if (*(char *)(in_RDI + 0x52) == '\0') {
      local_48 = local_20;
      bVar4 = true;
      if (((((*(char *)&local_20->archive == '/') || (*(char *)&local_20->archive == '\\')) &&
           ((*(char *)((long)&local_20->archive + 1) == '/' ||
            (*(char *)((long)&local_20->archive + 1) == '\\')))) &&
          ((*(char *)((long)&local_20->archive + 2) == '.' ||
           (*(char *)((long)&local_20->archive + 2) == '?')))) &&
         ((*(char *)((long)&local_20->archive + 3) == '/' ||
          (*(char *)((long)&local_20->archive + 3) == '\\')))) {
        if ((((*(char *)((long)&local_20->archive + 2) == '?') &&
             ((*(char *)((long)&local_20->archive + 4) == 'U' ||
              (*(char *)((long)&local_20->archive + 4) == 'u')))) &&
            ((*(char *)((long)&local_20->archive + 5) == 'N' ||
             (*(char *)((long)&local_20->archive + 5) == 'n')))) &&
           (((*(char *)((long)&local_20->archive + 6) == 'C' ||
             (*(char *)((long)&local_20->archive + 6) == 'c')) &&
            ((*(char *)((long)&local_20->archive + 7) == '/' ||
             (*(char *)((long)&local_20->archive + 7) == '\\')))))) {
          local_48 = (archive_entry *)&local_20->stat;
        }
        else {
          local_48 = (archive_entry *)((long)&local_20->archive + 4);
        }
        bVar4 = false;
      }
      do {
        paVar5 = local_48;
        if (((('`' < *(char *)&local_48->archive) && (*(char *)&local_48->archive < '{')) ||
            (('@' < *(char *)&local_48->archive && (*(char *)&local_48->archive < '[')))) &&
           (*(char *)((long)&local_48->archive + 1) == ':')) {
          local_48 = (archive_entry *)((long)&local_48->archive + 2);
          bVar4 = false;
        }
        while( true ) {
          in_stack_ffffffffffffff97 = true;
          if (*(char *)&local_48->archive != '/') {
            in_stack_ffffffffffffff97 = *(char *)&local_48->archive == '\\';
          }
          if ((bool)in_stack_ffffffffffffff97 == false) break;
          if (((*(char *)((long)&local_48->archive + 1) == '.') &&
              (*(char *)((long)&local_48->archive + 2) == '.')) &&
             ((*(char *)((long)&local_48->archive + 3) == '/' ||
              (*(char *)((long)&local_48->archive + 3) == '\\')))) {
            local_48 = (archive_entry *)((long)&local_48->archive + 3);
            bVar4 = false;
          }
          else {
            local_48 = (archive_entry *)((long)&local_48->archive + 1);
          }
        }
      } while (paVar5 != local_48);
      if ((local_48 != local_20) && (*(char *)(in_RDI + 0xb8) == '\0')) {
        if (bVar4) {
          lafe_warnc(0,"Removing leading \'%c\' from member names",
                     (ulong)(uint)(int)*(char *)&local_20->archive);
        }
        else {
          lafe_warnc(0,"Removing leading drive letter from member names");
        }
        *(undefined1 *)(in_RDI + 0xb8) = 1;
      }
      if (*(char *)&local_48->archive == '\0') {
        local_20 = (archive_entry *)0x1c0ddd;
      }
      else {
        local_20 = local_48;
      }
    }
    else {
      while( true ) {
        bVar4 = false;
        if (*(char *)&local_20->archive == '/') {
          bVar4 = *(char *)((long)&local_20->archive + 1) == '/';
        }
        if (!bVar4) break;
        local_20 = (archive_entry *)((long)&local_20->archive + 1);
      }
      in_stack_ffffffffffffff96 = 0;
    }
    paVar5 = local_20;
    paVar3 = (archive_entry *)archive_entry_pathname(local_20);
    if (paVar5 != paVar3) {
      pcVar2 = strdup((char *)local_20);
      archive_entry_copy_pathname
                ((archive_entry *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                 (char *)paVar5);
      free(pcVar2);
    }
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
edit_pathname(struct bsdtar *bsdtar, struct archive_entry *entry)
{
	const char *name = archive_entry_pathname(entry);
#if defined(HAVE_REGEX_H) || defined(HAVE_PCREPOSIX_H)
	char *subst_name;
	int r;

	r = apply_substitution(bsdtar, name, &subst_name, 0, 0);
	if (r == -1) {
		lafe_warnc(0, "Invalid substitution, skipping entry");
		return 1;
	}
	if (r == 1) {
		archive_entry_copy_pathname(entry, subst_name);
		if (*subst_name == '\0') {
			free(subst_name);
			return -1;
		} else
			free(subst_name);
		name = archive_entry_pathname(entry);
	}

	if (archive_entry_hardlink(entry)) {
		r = apply_substitution(bsdtar, archive_entry_hardlink(entry), &subst_name, 0, 1);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_hardlink(entry, subst_name);
			free(subst_name);
		}
	}
	if (archive_entry_symlink(entry) != NULL) {
		r = apply_substitution(bsdtar, archive_entry_symlink(entry), &subst_name, 1, 0);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_symlink(entry, subst_name);
			free(subst_name);
		}
	}
#endif

	/* Strip leading dir names as per --strip-components option. */
	if (bsdtar->strip_components > 0) {
		const char *linkname = archive_entry_hardlink(entry);

		name = strip_components(name, bsdtar->strip_components);
		if (name == NULL)
			return (1);

		if (linkname != NULL) {
			linkname = strip_components(linkname,
			    bsdtar->strip_components);
			if (linkname == NULL)
				return (1);
			archive_entry_copy_hardlink(entry, linkname);
		}
	}

	/* By default, don't write or restore absolute pathnames. */
	if (!bsdtar->option_absolute_paths) {
		const char *rp, *p = name;
		int slashonly = 1;

		/* Remove leading "//./" or "//?/" or "//?/UNC/"
		 * (absolute path prefixes used by Windows API) */
		if ((p[0] == '/' || p[0] == '\\') &&
		    (p[1] == '/' || p[1] == '\\') &&
		    (p[2] == '.' || p[2] == '?') &&
		    (p[3] == '/' || p[3] == '\\'))
		{
			if (p[2] == '?' &&
			    (p[4] == 'U' || p[4] == 'u') &&
			    (p[5] == 'N' || p[5] == 'n') &&
			    (p[6] == 'C' || p[6] == 'c') &&
			    (p[7] == '/' || p[7] == '\\'))
				p += 8;
			else
				p += 4;
			slashonly = 0;
		}
		do {
			rp = p;
			/* Remove leading drive letter from archives created
			 * on Windows. */
			if (((p[0] >= 'a' && p[0] <= 'z') ||
			     (p[0] >= 'A' && p[0] <= 'Z')) &&
				 p[1] == ':') {
				p += 2;
				slashonly = 0;
			}
			/* Remove leading "/../", "//", etc. */
			while (p[0] == '/' || p[0] == '\\') {
				if (p[1] == '.' && p[2] == '.' &&
					(p[3] == '/' || p[3] == '\\')) {
					p += 3; /* Remove "/..", leave "/"
							 * for next pass. */
					slashonly = 0;
				} else
					p += 1; /* Remove "/". */
			}
		} while (rp != p);

		if (p != name && !bsdtar->warned_lead_slash) {
			/* Generate a warning the first time this happens. */
			if (slashonly)
				lafe_warnc(0,
				    "Removing leading '%c' from member names",
				    name[0]);
			else
				lafe_warnc(0,
				    "Removing leading drive letter from "
				    "member names");
			bsdtar->warned_lead_slash = 1;
		}

		/* Special case: Stripping everything yields ".". */
		if (*p == '\0')
			name = ".";
		else
			name = p;
	} else {
		/* Strip redundant leading '/' characters. */
		while (name[0] == '/' && name[1] == '/')
			name++;
	}

	/* Safely replace name in archive_entry. */
	if (name != archive_entry_pathname(entry)) {
		char *q = strdup(name);
		archive_entry_copy_pathname(entry, q);
		free(q);
	}
	return (0);
}